

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS ref_egads_eval(REF_GEOM ref_geom,REF_INT geom,REF_DBL *xyz,REF_DBL *dxyz_dtuv)

{
  int type_00;
  REF_INT id_00;
  REF_DBL RStack_58;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL params [2];
  int local_3c;
  REF_INT i;
  REF_INT id;
  REF_INT type;
  REF_DBL *dxyz_dtuv_local;
  REF_DBL *xyz_local;
  REF_INT geom_local;
  REF_GEOM ref_geom_local;
  
  if ((geom < 0) || (ref_geom->max <= geom)) {
    ref_geom_local._4_4_ = 3;
  }
  else {
    RStack_58 = 0.0;
    params[0] = 0.0;
    type_00 = ref_geom->descr[geom * 6];
    id_00 = ref_geom->descr[geom * 6 + 1];
    for (local_3c = 0; local_3c < type_00; local_3c = local_3c + 1) {
      *(REF_DBL *)((long)&stack0xffffffffffffffa8 + (long)local_3c * 8) =
           ref_geom->param[local_3c + geom * 2];
    }
    ref_geom_local._4_4_ =
         ref_egads_eval_at(ref_geom,type_00,id_00,&stack0xffffffffffffffa8,xyz,dxyz_dtuv);
    if (ref_geom_local._4_4_ == 0) {
      ref_geom_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0xdeb
             ,"ref_egads_eval",(ulong)ref_geom_local._4_4_,"eval at");
    }
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_egads_eval(REF_GEOM ref_geom, REF_INT geom, REF_DBL *xyz,
                                  REF_DBL *dxyz_dtuv) {
  REF_INT type, id, i;
  REF_DBL params[2];
  if (geom < 0 || ref_geom_max(ref_geom) <= geom) return REF_INVALID;
  params[0] = 0.0;
  params[1] = 0.0;
  type = ref_geom_type(ref_geom, geom);
  id = ref_geom_id(ref_geom, geom);

  for (i = 0; i < type; i++) {
    params[i] = ref_geom_param(ref_geom, i, geom);
  }
  RSS(ref_egads_eval_at(ref_geom, type, id, params, xyz, dxyz_dtuv), "eval at");
  return REF_SUCCESS;
}